

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bool __thiscall
lzham::lzcompressor::compress_block_internal(lzcompressor *this,void *pBuf,uint buf_len)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  uchar *puVar5;
  search_accelerator *dict;
  bool bVar7;
  char cVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  state *psVar12;
  undefined8 uVar13;
  lzdecision *plVar14;
  undefined4 uVar15;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pData_ptr_00;
  void *extraout_RDX_01;
  semaphore *psVar19;
  undefined1 *puVar20;
  int *piVar21;
  parse_thread_state *ppVar22;
  uint uVar23;
  symbol_codec *codec;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint parse_thread_index;
  long lVar28;
  uint64 data;
  lzdecision lzdec;
  lzdecision lzdec_00;
  uint cur_dict_ofs;
  parse_thread_state *local_f0;
  state *local_e8;
  uint bytes_to_match;
  symbol_codec *local_d8;
  search_accelerator *local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  state *local_a8;
  state *local_a0;
  ulong local_98;
  parse_thread_state *local_90;
  uint local_84;
  uint *local_80;
  void *local_78;
  void *local_70;
  parse_thread_state *local_68;
  state *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  void *pData_ptr;
  
  if (this->m_src_size < 0) {
    return false;
  }
  uVar24 = (ulong)buf_len;
  this->m_src_size = this->m_src_size + (ulong)buf_len;
  bVar7 = search_accelerator::add_bytes_begin(&this->m_accel,buf_len,(uint8 *)pBuf);
  if (bVar7) {
    local_e8 = &this->m_state;
    psVar12 = &this->m_start_of_block_state;
    local_d0 = &this->m_accel;
    local_78 = pBuf;
    state::operator=(psVar12,local_e8);
    uVar25 = (this->m_accel).m_max_dict_size - 1 & (this->m_accel).m_lookahead_pos;
    this->m_block_start_dict_ofs = uVar25;
    codec = &this->m_codec;
    uVar10 = (uint)codec;
    cur_dict_ofs = uVar25;
    bytes_to_match = buf_len;
    cVar8 = lzham::symbol_codec::start_encoding(uVar10);
    if (((cVar8 != '\0') && (cVar8 = lzham::symbol_codec::encode_bits(uVar10,1), cVar8 != '\0')) &&
       (cVar8 = lzham::symbol_codec::encode_arith_init(), cVar8 != '\0')) {
      state::start_of_block(local_e8,local_d0,uVar25,this->m_block_index);
      uVar25 = (this->m_params).m_lzham_compress_flags & 0x10;
      if (uVar25 != 0) {
        state::reset_update_rate(local_e8);
      }
      lzham::symbol_codec::encode_bits(uVar10,uVar25 >> 4);
      local_84 = this->m_step;
      local_68 = this->m_parse_thread_state + 8;
      local_a8 = &this->m_parse_thread_state[8].super_raw_parse_thread_state.m_state;
      local_80 = (this->m_state).super_state_base.m_match_hist;
      local_f0 = this->m_parse_thread_state;
      local_60 = &this->m_parse_thread_state[0].super_raw_parse_thread_state.m_state;
      local_b8 = 0;
      local_d8 = codec;
      local_c0 = (ulong)buf_len;
LAB_0010b099:
      dict = local_d0;
      if (buf_len != 0) {
        if ((0x17f < buf_len) && ((this->m_params).m_pSeed_bytes != (void *)0x0)) {
          this->m_parse_thread_state[8].super_raw_parse_thread_state.m_pState = local_a8;
          state::operator=(local_a8,local_e8);
          this->m_parse_thread_state[8].super_raw_parse_thread_state.m_state.super_state_base.
          m_cur_ofs = cur_dict_ofs;
          this->m_parse_thread_state[8].super_raw_parse_thread_state.m_start_ofs = cur_dict_ofs;
          uVar26 = 0x10000;
          if (buf_len < 0x10000) {
            uVar26 = buf_len;
          }
          this->m_parse_thread_state[8].super_raw_parse_thread_state.m_bytes_to_match = uVar26;
          uVar10 = buf_len / 0x180;
          if (buf_len < 0x300) {
            uVar10 = 2;
          }
          this->m_parse_thread_state[8].super_raw_parse_thread_state.m_max_greedy_decisions = uVar10
          ;
          this->m_parse_thread_state[8].super_raw_parse_thread_state.m_greedy_parse_gave_up = false;
          this->m_parse_thread_state[8].super_raw_parse_thread_state.m_issue_reset_state_partial =
               false;
          this->m_parse_thread_state[8].super_raw_parse_thread_state.
          m_greedy_parse_total_bytes_coded = 0;
          this->m_parse_thread_state[8].super_raw_parse_thread_state.m_parse_early_out_thresh =
               0xffffffff;
          this->m_parse_thread_state[8].super_raw_parse_thread_state.m_bytes_actually_parsed = 0;
          this->m_parse_thread_state[8].super_raw_parse_thread_state.m_use_semaphore = false;
          bVar9 = greedy_parse(this,local_68);
          bVar7 = this->m_parse_thread_state[8].super_raw_parse_thread_state.m_greedy_parse_gave_up;
          if (bVar9) {
            if ((bVar7 & 1U) != 0) goto LAB_0010b168;
            uVar11 = this->m_parse_thread_state[8].super_raw_parse_thread_state.m_best_decisions.
                     m_size;
          }
          else {
            if ((bVar7 & 1U) == 0) {
              return false;
            }
LAB_0010b168:
            uVar18 = (ulong)this->m_parse_thread_state[8].super_raw_parse_thread_state.
                            m_best_decisions.m_size;
            piVar21 = &(this->m_parse_thread_state[8].super_raw_parse_thread_state.m_best_decisions.
                       m_p)->m_len;
            uVar10 = 0;
            uVar25 = 0;
            uVar11 = 0;
            for (uVar27 = 0; uVar16 = uVar18, uVar18 != uVar27; uVar27 = uVar27 + 1) {
              uVar1 = *piVar21;
              uVar23 = uVar1 + (uVar1 == 0);
              if ((uVar1 < 0x102) && (uVar11 = uVar11 + 1, uVar16 = uVar27, 0x10 < uVar11)) break;
              uVar25 = uVar25 + uVar23;
              if (uVar10 <= uVar23) {
                uVar10 = uVar23;
              }
              piVar21 = piVar21 + 3;
            }
            uVar11 = (uint)uVar16;
            if ((uVar10 < 0x102) || ((uint)((ulong)uVar25 / (uVar16 & 0xffffffff)) < 0x180))
            goto LAB_0010b257;
          }
          if (uVar11 != 0) {
            for (lVar28 = 0; (ulong)uVar11 * 0xc - lVar28 != 0; lVar28 = lVar28 + 0xc) {
              plVar14 = this->m_parse_thread_state[8].super_raw_parse_thread_state.m_best_decisions.
                        m_p;
              lzdec.m_dist = *(int *)((long)&plVar14->m_dist + lVar28);
              lzdec._0_8_ = *(undefined8 *)((long)&plVar14->m_pos + lVar28);
              bVar7 = code_decision(this,lzdec,&cur_dict_ofs,&bytes_to_match);
              if (!bVar7) {
                return false;
              }
              iVar2 = *(int *)((long)&(this->m_parse_thread_state[8].super_raw_parse_thread_state.
                                       m_best_decisions.m_p)->m_len + lVar28);
              search_accelerator::advance_bytes(local_d0,iVar2 + (uint)(iVar2 == 0));
            }
            buf_len = bytes_to_match;
            if ((this->m_parse_thread_state[8].super_raw_parse_thread_state.m_greedy_parse_gave_up &
                bytes_to_match != 0) == 0) {
              if ((local_b8 & 1) == 0) {
                uVar13 = lzham::adler32(local_78,local_c0,this->m_src_adler32);
                this->m_src_adler32 = (uint32)uVar13;
                local_b8 = CONCAT71((int7)((ulong)uVar13 >> 8),1);
                buf_len = bytes_to_match;
              }
              goto LAB_0010b099;
            }
          }
        }
LAB_0010b257:
        uVar10 = (buf_len + 0xbff) / 0xc00;
        if (this->m_num_parse_threads < uVar10) {
          uVar10 = this->m_num_parse_threads;
        }
        uVar25 = (this->m_params).m_lzham_compress_flags;
        if (((((uVar25 & 4) == 0) && (this->m_use_task_pool == true)) &&
            ((this->m_accel).m_max_helper_threads != 0)) &&
           (uVar10 = uVar10 + (int)(this->m_accel).m_num_completed_helper_threads, 7 < uVar10)) {
          uVar10 = 8;
        }
        pData_ptr = (void *)0x1;
        uVar11 = 1;
        if ((uVar25 & 0x40) != 0) {
          uVar10 = uVar11;
        }
        if (buf_len < 0x600) {
          uVar10 = uVar11;
        }
        uVar25 = uVar10;
        if (cur_dict_ofs - this->m_block_start_dict_ofs < 0x3000) {
          uVar25 = uVar11;
        }
        if (this->m_block_index != 0) {
          uVar25 = uVar10;
        }
        uVar10 = uVar25 * 0xc00;
        if (buf_len < uVar25 * 0xc00) {
          uVar10 = buf_len;
        }
        local_b0 = CONCAT44(local_b0._4_4_,uVar10);
        if (uVar25 == 1) {
          local_58._0_4_ = (local_e8->super_state_base).m_cur_ofs;
          local_58._4_4_ = (local_e8->super_state_base).m_cur_state;
          uStack_50 = 0;
          local_48 = *(undefined8 *)local_80;
          uStack_40 = *(undefined8 *)(local_80 + 2);
        }
        local_70 = (void *)(ulong)(uVar25 - 1);
        local_c8 = (ulong)uVar25;
        lVar28 = local_c8 * 0x156800;
        local_90 = (parse_thread_state *)((long)local_70 * 0x156800);
        ppVar22 = local_f0;
        uVar26 = cur_dict_ofs;
        local_a0 = psVar12;
        local_98 = uVar24;
        for (puVar20 = (undefined1 *)0x0; uVar24 = local_98, psVar12 = local_a0,
            lVar28 - (long)puVar20 != 0; puVar20 = puVar20 + 0x156800) {
          if (uVar25 == 1) {
            *(state **)((long)&(ppVar22->super_raw_parse_thread_state).m_pState + (long)puVar20) =
                 local_e8;
            psVar12 = local_e8;
          }
          else {
            *(state **)((long)&(ppVar22->super_raw_parse_thread_state).m_pState + (long)puVar20) =
                 (state *)(puVar20 + (long)&local_60->super_state_base);
            state::operator=((state *)(puVar20 + (long)&local_60->super_state_base),local_e8);
            psVar12 = *(state **)
                       ((long)&(local_f0->super_raw_parse_thread_state).m_pState + (long)puVar20);
            pData_ptr = extraout_RDX;
            ppVar22 = local_f0;
          }
          (psVar12->super_state_base).m_cur_ofs = uVar26;
          if (puVar20 != (undefined1 *)0x0) {
            state::reset_state_partial
                      (*(state **)
                        ((long)&(ppVar22->super_raw_parse_thread_state).m_pState + (long)puVar20));
            pData_ptr = extraout_RDX_00;
            ppVar22 = local_f0;
          }
          (&(ppVar22->super_raw_parse_thread_state).m_issue_reset_state_partial)[(long)puVar20] =
               puVar20 != (undefined1 *)0x0;
          *(uint *)(puVar20 + (long)&ppVar22->super_raw_parse_thread_state) = uVar26;
          uVar11 = uVar10;
          if (local_90 != (parse_thread_state *)puVar20) {
            uVar11 = (uint)local_b0 / uVar25;
            pData_ptr = (void *)((local_b0 & 0xffffffff) % (ulong)uVar25);
          }
          if (0xbff < uVar11) {
            uVar11 = 0xc00;
          }
          *(uint *)((long)&this->m_parse_thread_state[0].super_raw_parse_thread_state.
                           m_bytes_to_match + (long)puVar20) = uVar11;
          *(uint *)((long)&this->m_parse_thread_state[0].super_raw_parse_thread_state.
                           m_max_parse_node_states + (long)puVar20) =
               (this->m_params).m_extreme_parsing_max_best_arrivals;
          *(undefined4 *)
           ((long)&this->m_parse_thread_state[0].super_raw_parse_thread_state.m_max_greedy_decisions
           + (long)puVar20) = 0xffffffff;
          (&this->m_parse_thread_state[0].super_raw_parse_thread_state.m_greedy_parse_gave_up)
          [(long)puVar20] = false;
          *(undefined8 *)
           ((long)&this->m_parse_thread_state[0].super_raw_parse_thread_state.
                   m_parse_early_out_thresh + (long)puVar20) = 0xffffffff;
          bVar17 = 1 < uVar25 & this->m_use_task_pool;
          pData_ptr = (void *)CONCAT71((int7)((ulong)pData_ptr >> 8),bVar17);
          (&this->m_parse_thread_state[0].super_raw_parse_thread_state.m_use_semaphore)
          [(long)puVar20] = (bool)(puVar20 != (undefined1 *)0x0 & bVar17);
          if ((uVar25 == 1) && ((this->m_params).m_compression_level == cCompressionLevelUber)) {
            uVar15 = 0x40;
            if (((this->m_params).m_lzham_compress_flags & 2) != 0) {
              uVar15 = 0x10;
            }
            *(undefined4 *)
             ((long)&this->m_parse_thread_state[0].super_raw_parse_thread_state.
                     m_parse_early_out_thresh + (long)puVar20) = uVar15;
          }
          uVar26 = uVar26 + uVar11;
          uVar10 = uVar10 - uVar11;
        }
        if ((uVar25 < 2) || (this->m_use_task_pool == false)) {
          for (data = 0; local_c8 != data; data = data + 1) {
            parse_job_callback(this,data,pData_ptr);
            pData_ptr = extraout_RDX_01;
          }
          uVar27 = local_c0;
          if (uVar25 == 1) {
            (local_e8->super_state_base).m_cur_ofs = (undefined4)local_58;
            (local_e8->super_state_base).m_cur_state = local_58._4_4_;
            *(undefined8 *)local_80 = local_48;
            *(undefined8 *)(local_80 + 2) = uStack_40;
          }
        }
        else {
          bVar7 = task_pool::
                  queue_multiple_object_tasks<lzham::lzcompressor,void(lzham::lzcompressor::*)(unsigned_long_long,void*)>
                            ((this->m_params).m_pTask_pool,this,
                             (offset_in_lzcompressor_to_subr)parse_job_callback,0,1,local_70);
          uVar24 = local_98;
          psVar12 = local_a0;
          uVar27 = local_c0;
          if (!bVar7) {
            return false;
          }
          parse_job_callback(this,0,pData_ptr_00);
        }
        codec = local_d8;
        if ((local_b8 & 1) == 0) {
          uVar13 = lzham::adler32(local_78,uVar27,this->m_src_adler32);
          this->m_src_adler32 = (uint32)uVar13;
          local_b8 = CONCAT71((int7)((ulong)uVar13 >> 8),1);
        }
        uVar26 = 0;
        uVar27 = 0;
        while (uVar27 != local_c8) {
          ppVar22 = local_f0 + uVar27;
          if (local_f0[uVar27].super_raw_parse_thread_state.m_use_semaphore == true) {
            semaphore::wait(&(ppVar22->super_raw_parse_thread_state).m_finished,
                            (void *)0xffffffffffffffff);
            (ppVar22->super_raw_parse_thread_state).m_use_semaphore = false;
          }
          uVar24 = local_c8;
          if ((ppVar22->super_raw_parse_thread_state).m_failed == true) {
            psVar19 = &this->m_parse_thread_state[1].super_raw_parse_thread_state.m_finished;
            for (uVar27 = 1; uVar27 < uVar24; uVar27 = uVar27 + 1) {
              if (*(undefined1 *)((long)(psVar19 + -1) + 0x1f) == '\x01') {
                semaphore::wait(psVar19,(void *)0xffffffff);
                *(undefined1 *)((long)(psVar19 + -1) + 0x1f) = 0;
              }
              psVar19 = psVar19 + 0xab40;
            }
            return false;
          }
          if ((ppVar22->super_raw_parse_thread_state).m_issue_reset_state_partial == true) {
            bVar7 = state::encode_reset_state_partial(local_e8,codec,local_d0,cur_dict_ofs);
            uVar24 = local_c8;
            if (!bVar7) {
              psVar19 = &this->m_parse_thread_state[1].super_raw_parse_thread_state.m_finished;
              for (uVar27 = 1; uVar27 < uVar24; uVar27 = uVar27 + 1) {
                if (*(undefined1 *)((long)(psVar19 + -1) + 0x1f) == '\x01') {
                  semaphore::wait(psVar19,(void *)0xffffffff);
                  *(undefined1 *)((long)(psVar19 + -1) + 0x1f) = 0;
                }
                psVar19 = psVar19 + 0xab40;
              }
              return false;
            }
            this->m_step = this->m_step + 1;
          }
          uVar3 = (ppVar22->super_raw_parse_thread_state).m_best_decisions.m_size;
          local_b0 = uVar27;
          if (uVar3 != 0) {
            uVar25 = uVar3 - 1;
            bVar7 = (ppVar22->super_raw_parse_thread_state).m_emit_decisions_backwards;
            uVar10 = uVar25;
            if (bVar7 == false) {
              uVar10 = (uint)bVar7;
            }
            if (bVar7 != false) {
              uVar25 = 0;
            }
            uVar11 = -(uint)bVar7 | 1;
            plVar14 = (ppVar22->super_raw_parse_thread_state).m_best_decisions.m_p;
            local_90 = ppVar22;
            do {
              uVar4 = plVar14[uVar10].m_pos;
              uVar6 = plVar14[uVar10].m_len;
              lzdec_00.m_len = uVar6;
              lzdec_00.m_pos = uVar4;
              lzdec_00.m_dist = plVar14[uVar10].m_dist;
              bVar7 = code_decision(this,lzdec_00,&cur_dict_ofs,&bytes_to_match);
              uVar24 = local_c8;
              if (!bVar7) {
                psVar19 = &this->m_parse_thread_state[1].super_raw_parse_thread_state.m_finished;
                for (uVar27 = 1; uVar27 < uVar24; uVar27 = uVar27 + 1) {
                  if (*(undefined1 *)((long)(psVar19 + -1) + 0x1f) == '\x01') {
                    semaphore::wait(psVar19,(void *)0xffffffff);
                    *(undefined1 *)((long)(psVar19 + -1) + 0x1f) = 0;
                  }
                  psVar19 = psVar19 + 0xab40;
                }
                return false;
              }
              plVar14 = (local_90->super_raw_parse_thread_state).m_best_decisions.m_p;
              uVar26 = uVar26 + plVar14[uVar10].m_len + (uint)(plVar14[uVar10].m_len == 0);
              uVar10 = uVar10 + uVar11;
            } while (uVar25 + uVar11 != uVar10);
          }
          psVar12 = local_a0;
          codec = local_d8;
          uVar24 = local_98;
          uVar27 = local_b0 + 1;
        }
        search_accelerator::advance_bytes(local_d0,uVar26);
        buf_len = bytes_to_match;
        goto LAB_0010b099;
      }
      search_accelerator::add_bytes_end(local_d0);
      bVar7 = state::encode_eob(local_e8,codec,dict,cur_dict_ofs);
      if ((bVar7) && (cVar8 = lzham::symbol_codec::stop_encoding(SUB81(codec,0)), cVar8 != '\0')) {
        if ((uint)uVar24 <= *(uint *)&this->field_0x4d0) {
          state::operator=(local_e8,psVar12);
          this->m_step = local_84;
          lzham::symbol_codec::reset();
          uVar10 = (uint)codec;
          cVar8 = lzham::symbol_codec::start_encoding(uVar10);
          if (cVar8 == '\0') {
            return false;
          }
          cVar8 = lzham::symbol_codec::encode_bits(uVar10,2);
          if (cVar8 == '\0') {
            return false;
          }
          uVar25 = (uint)uVar24 - 1;
          cVar8 = lzham::symbol_codec::encode_bits(uVar10,uVar25);
          if (cVar8 == '\0') {
            return false;
          }
          cVar8 = lzham::symbol_codec::encode_bits
                            ((uint)local_d8,(uVar25 >> 0x10 ^ uVar25 >> 8 ^ uVar25) & 0xff);
          if (cVar8 == '\0') {
            return false;
          }
          cVar8 = lzham::symbol_codec::encode_align_to_byte();
          if (cVar8 == '\0') {
            return false;
          }
          uVar10 = this->m_block_start_dict_ofs;
          puVar5 = (this->m_accel).m_dict.m_p;
          for (lVar28 = 0; (int)local_c0 != (int)lVar28; lVar28 = lVar28 + 1) {
            cVar8 = lzham::symbol_codec::encode_bits
                              ((uint)local_d8,(uint)puVar5[lVar28 + (ulong)uVar10]);
            if (cVar8 == '\0') {
              return false;
            }
          }
          cVar8 = lzham::symbol_codec::stop_encoding(SUB81(local_d8,0));
          if (cVar8 == '\0') {
            return false;
          }
        }
        if ((this->m_comp_buf).m_size == 0) {
          vector<unsigned_char>::swap(&this->m_comp_buf,(vector<unsigned_char> *)&this->field_0x4c8)
          ;
        }
        else {
          bVar7 = vector<unsigned_char>::append
                            (&this->m_comp_buf,(vector<unsigned_char> *)&this->field_0x4c8);
          if (!bVar7) {
            return false;
          }
        }
        this->m_block_index = this->m_block_index + 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool lzcompressor::compress_block_internal(const void* pBuf, uint buf_len)
   {
      scoped_perf_section compress_block_timer(cVarArgs, "****** compress_block %u", m_block_index);

      LZHAM_ASSERT(pBuf);
      LZHAM_ASSERT(buf_len <= m_params.m_block_size);

      LZHAM_ASSERT(m_src_size >= 0);
      if (m_src_size < 0)
         return false;

      m_src_size += buf_len;

      // Important: Don't do any expensive work until after add_bytes_begin() is called, to increase parallelism.
      if (!m_accel.add_bytes_begin(buf_len, static_cast<const uint8*>(pBuf)))
      {
         LZHAM_LOG_ERROR(7047);
         return false;
      }

      bool computed_adler32 = false;

      m_start_of_block_state = m_state;

      m_block_start_dict_ofs = m_accel.get_lookahead_pos() & (m_accel.get_max_dict_size() - 1);

      uint cur_dict_ofs = m_block_start_dict_ofs;

      uint bytes_to_match = buf_len;

      if (!m_codec.start_encoding((buf_len * 9) / 8))
      {
         LZHAM_LOG_ERROR(7048);
         return false;
      }

      if (!m_block_index)
      {
         if (!send_configuration())
         {
            LZHAM_LOG_ERROR(7049);
            return false;
         }
      }

#ifdef LZHAM_LZDEBUG
      m_codec.encode_bits(166, 12);
#endif

      if (!m_codec.encode_bits(cCompBlock, cBlockHeaderBits))
      {
         LZHAM_LOG_ERROR(7050);
         return false;
      }

      if (!m_codec.encode_arith_init())
      {
         LZHAM_LOG_ERROR(7051);
         return false;
      }

      m_state.start_of_block(m_accel, cur_dict_ofs, m_block_index);

      bool emit_reset_update_rate_command = false;

      if (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_TRADEOFF_DECOMPRESSION_RATE_FOR_COMP_RATIO)
      {
         emit_reset_update_rate_command = true;

         m_state.reset_update_rate();
      }

      // TODO: We could also issue a full huff/arith table reset (code 2), and see if that actually improves the block's compression.
      m_codec.encode_bits(emit_reset_update_rate_command ? 1 : 0, cBlockFlushTypeBits);

      //coding_stats initial_stats(m_stats);

      uint initial_step = m_step;

      while (bytes_to_match)
      {
         const uint cAvgAcceptableGreedyMatchLen = 384;
         if ((m_params.m_pSeed_bytes) && (bytes_to_match >= cAvgAcceptableGreedyMatchLen))
         {
            parse_thread_state &greedy_parse_state = m_parse_thread_state[cMaxParseThreads];

            greedy_parse_state.m_pState = &greedy_parse_state.m_state;
            greedy_parse_state.m_state = m_state;
            greedy_parse_state.m_state.m_cur_ofs = cur_dict_ofs;

            greedy_parse_state.m_issue_reset_state_partial = false;
            greedy_parse_state.m_start_ofs = cur_dict_ofs;
            greedy_parse_state.m_bytes_to_match = LZHAM_MIN(bytes_to_match, static_cast<uint>(CLZBase::cMaxHugeMatchLen));

            greedy_parse_state.m_max_greedy_decisions = LZHAM_MAX((bytes_to_match / cAvgAcceptableGreedyMatchLen), 2);
            greedy_parse_state.m_greedy_parse_gave_up = false;
            greedy_parse_state.m_greedy_parse_total_bytes_coded = 0;

            greedy_parse_state.m_parse_early_out_thresh = UINT_MAX;
            greedy_parse_state.m_bytes_actually_parsed = 0;

            greedy_parse_state.m_use_semaphore = false;

            if (!greedy_parse(greedy_parse_state))
            {
               if (!greedy_parse_state.m_greedy_parse_gave_up)
               {
                  LZHAM_LOG_ERROR(7052);
                  return false;
               }
            }

            uint num_greedy_decisions_to_code = 0;

            const lzham::vector<lzdecision> &best_decisions = greedy_parse_state.m_best_decisions;

            if (!greedy_parse_state.m_greedy_parse_gave_up)
               num_greedy_decisions_to_code = best_decisions.size();
            else
            {
               uint num_small_decisions = 0;
               uint total_match_len = 0;
               uint max_match_len = 0;

               uint i;
               for (i = 0; i < best_decisions.size(); i++)
               {
                  const lzdecision &dec = best_decisions[i];
                  if (dec.get_len() <= CLZBase::cMaxMatchLen)
                  {
                     num_small_decisions++;
                     if (num_small_decisions > 16)
                        break;
                  }

                  total_match_len += dec.get_len();
                  max_match_len = LZHAM_MAX(max_match_len, dec.get_len());
               }

               if (max_match_len > CLZBase::cMaxMatchLen)
               {
                  if ((total_match_len / i) >= cAvgAcceptableGreedyMatchLen)
                  {
                     num_greedy_decisions_to_code = i;
                  }
               }
            }

            if (num_greedy_decisions_to_code)
            {
               for (uint i = 0; i < num_greedy_decisions_to_code; i++)
               {
                  LZHAM_ASSERT(best_decisions[i].m_pos == (int)cur_dict_ofs);
                  //LZHAM_ASSERT(i >= 0);
                  LZHAM_ASSERT(i < best_decisions.size());

#if LZHAM_UPDATE_STATS
                  bit_cost_t cost = m_state.get_cost(*this, m_accel, best_decisions[i]);
                  m_stats.update(best_decisions[i], m_state, m_accel, cost);
#endif

                  if (!code_decision(best_decisions[i], cur_dict_ofs, bytes_to_match))
                  {
                     LZHAM_LOG_ERROR(7053);
                     return false;
                  }

                  m_accel.advance_bytes(best_decisions[i].get_len());
               }

               if ((!greedy_parse_state.m_greedy_parse_gave_up) || (!bytes_to_match))
			   {
				   if (!computed_adler32)
				   {
					   computed_adler32 = true;

					   scoped_perf_section add_bytes_timer("adler32");
					   m_src_adler32 = adler32(pBuf, buf_len, m_src_adler32);
				   }

                  continue;
			   }
            }
         }

         uint num_parse_jobs = LZHAM_MIN(m_num_parse_threads, (bytes_to_match + cMaxParseGraphNodes - 1) / cMaxParseGraphNodes);
         if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_DETERMINISTIC_PARSING) == 0)
         {
            if (m_use_task_pool && m_accel.get_max_helper_threads())
            {
               // Increase the number of active parse jobs as the match finder finishes up to keep CPU utilization up.
               num_parse_jobs += m_accel.get_num_completed_helper_threads();
               num_parse_jobs = LZHAM_MIN(num_parse_jobs, cMaxParseThreads);
            }
         }

         // Don't bother threading if the remaining bytes to parse is too small.
         if ((bytes_to_match < 1536) || (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_FORCE_SINGLE_THREADED_PARSING))
            num_parse_jobs = 1;

         // Update the coding statistics more frequently near the beginning of streams.
         if ((!m_block_index) && ((cur_dict_ofs - m_block_start_dict_ofs) < cMaxParseGraphNodes * 4))
            num_parse_jobs = 1;

         uint parse_thread_start_ofs = cur_dict_ofs;
         uint parse_thread_total_size = LZHAM_MIN(bytes_to_match, cMaxParseGraphNodes * num_parse_jobs);

         uint parse_thread_remaining = parse_thread_total_size;

         state_base saved_state;
         if (num_parse_jobs == 1)
            m_state.save_partial_state(saved_state);

         for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
         {
            parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];

            if (num_parse_jobs == 1)
            {
               parse_thread.m_pState = &m_state;
            }
            else
            {
               parse_thread.m_pState = &parse_thread.m_state;
               parse_thread.m_state = m_state;
            }

            parse_thread.m_pState->m_cur_ofs = parse_thread_start_ofs;

            if (parse_thread_index > 0)
            {
               parse_thread.m_pState->reset_state_partial();
               parse_thread.m_issue_reset_state_partial = true;
            }
            else
            {
               parse_thread.m_issue_reset_state_partial = false;
            }

            parse_thread.m_start_ofs = parse_thread_start_ofs;
            if (parse_thread_index == (num_parse_jobs - 1))
               parse_thread.m_bytes_to_match = parse_thread_remaining;
            else
               parse_thread.m_bytes_to_match = parse_thread_total_size / num_parse_jobs;

            parse_thread.m_bytes_to_match = LZHAM_MIN(parse_thread.m_bytes_to_match, cMaxParseGraphNodes);
            LZHAM_ASSERT(parse_thread.m_bytes_to_match > 0);

            parse_thread.m_max_parse_node_states = m_params.m_extreme_parsing_max_best_arrivals;
            parse_thread.m_max_greedy_decisions = UINT_MAX;
            parse_thread.m_greedy_parse_gave_up = false;

            parse_thread.m_parse_early_out_thresh = UINT_MAX;
            parse_thread.m_bytes_actually_parsed = 0;

            parse_thread.m_use_semaphore = ((m_use_task_pool) && (num_parse_jobs > 1)) && (parse_thread_index > 0);

            if ((m_params.m_compression_level == cCompressionLevelUber) && (num_parse_jobs == 1))
            {
               // Allow the parsers to exit early if they encounter a graph bottleneck, so we can move the coding statistics forward before parsing again.
               parse_thread.m_parse_early_out_thresh = (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) ? 16 : 64;
            }

            parse_thread_start_ofs += parse_thread.m_bytes_to_match;
            parse_thread_remaining -= parse_thread.m_bytes_to_match;
         }

         {
            scoped_perf_section parse_timer("parsing");

            if ((m_use_task_pool) && (num_parse_jobs > 1))
            {
               {
                  scoped_perf_section queue_task_timer("queuing parse tasks");

                  if (!m_params.m_pTask_pool->queue_multiple_object_tasks(this, &lzcompressor::parse_job_callback, 1, num_parse_jobs - 1))
                     return false;
               }

               parse_job_callback(0, NULL);
            }
            else
            {
               for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
               {
                  parse_job_callback(parse_thread_index, NULL);
               }
            }
         }

         if (num_parse_jobs == 1)
            m_state.restore_partial_state(saved_state);

         if (!computed_adler32)
         {
            computed_adler32 = true;

            scoped_perf_section add_bytes_timer("adler32");
            m_src_adler32 = adler32(pBuf, buf_len, m_src_adler32);
         }

#define LZHAM_RELEASE_SEMAPHORES for (uint pti = 1; pti < num_parse_jobs; pti++) if (m_parse_thread_state[pti].m_use_semaphore) { m_parse_thread_state[pti].m_finished.wait(); m_parse_thread_state[pti].m_use_semaphore = false; }

         {
            scoped_perf_section coding_timer("coding");

            uint total_bytes_parsed = 0;

            for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
            {
               parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];

               if (parse_thread.m_use_semaphore)
               {
                  scoped_perf_section sect(cVarArgs, "Waiting for parser %u", parse_thread_index);
                  m_parse_thread_state[parse_thread_index].m_finished.wait();
                  m_parse_thread_state[parse_thread_index].m_use_semaphore = false;
               }

               if (parse_thread.m_failed)
               {
                  LZHAM_RELEASE_SEMAPHORES
                  LZHAM_LOG_ERROR(7054);
                  return false;
               }

               const lzham::vector<lzdecision> &best_decisions = parse_thread.m_best_decisions;

               if (parse_thread.m_issue_reset_state_partial)
               {
                  if (!m_state.encode_reset_state_partial(m_codec, m_accel, cur_dict_ofs))
                  {
                     LZHAM_RELEASE_SEMAPHORES
                     LZHAM_LOG_ERROR(7055);
                     return false;
                  }
                  m_step++;
               }

               if (best_decisions.size())
               {
                  int i = 0;
                  int end_dec_index = static_cast<int>(best_decisions.size()) - 1;
                  int dec_step = 1;
                  if (parse_thread.m_emit_decisions_backwards)
                  {
                     i = static_cast<int>(best_decisions.size()) - 1;
                     end_dec_index = 0;
                     dec_step = -1;
                     LZHAM_ASSERT(best_decisions.back().m_pos == (int)parse_thread.m_start_ofs);
                  }
                  else
                  {
                     LZHAM_ASSERT(best_decisions.front().m_pos == (int)parse_thread.m_start_ofs);
                  }

                  // Loop rearranged to avoid bad x64 codegen problem with MSVC2008.
                  for ( ; ; )
                  {
                     LZHAM_ASSERT(best_decisions[i].m_pos == (int)cur_dict_ofs);
                     LZHAM_ASSERT(i >= 0);
                     LZHAM_ASSERT(i < (int)best_decisions.size());

#if LZHAM_UPDATE_STATS
                     bit_cost_t cost = m_state.get_cost(*this, m_accel, best_decisions[i]);
                     m_stats.update(best_decisions[i], m_state, m_accel, cost);
                     //m_state.print(m_codec, *this, m_accel, best_decisions[i]);
#endif

                     if (!code_decision(best_decisions[i], cur_dict_ofs, bytes_to_match))
                     {
                        LZHAM_RELEASE_SEMAPHORES
                        LZHAM_LOG_ERROR(7056);
                        return false;
                     }

                     total_bytes_parsed += best_decisions[i].get_len();

                     if (i == end_dec_index)
                        break;
                     i += dec_step;
                  }

                  LZHAM_NOTE_UNUSED(i);
               }

               LZHAM_ASSERT(cur_dict_ofs == parse_thread.m_start_ofs + parse_thread.m_bytes_actually_parsed);

            } // parse_thread_index

            m_accel.advance_bytes(total_bytes_parsed);

         } // coding

      } // while (bytes_to_match)

      {
         scoped_perf_section add_bytes_timer("add_bytes_end");
         m_accel.add_bytes_end();
      }

      if (!m_state.encode_eob(m_codec, m_accel, cur_dict_ofs))
      {
         LZHAM_LOG_ERROR(7057);
         return false;
      }

#ifdef LZHAM_LZDEBUG
      if (!m_codec.encode_bits(366, 12))
      {
         LZHAM_LOG_ERROR(7058);
         return false;
      }
#endif

      {
         scoped_perf_section stop_encoding_timer("stop_encoding");
         if (!m_codec.stop_encoding(true))
         {
            LZHAM_LOG_ERROR(7059);
            return false;
         }
      }

      // Coded the entire block - now see if it makes more sense to just send a raw/uncompressed block.

      uint compressed_size = m_codec.get_encoding_buf().size();
      LZHAM_NOTE_UNUSED(compressed_size);

      //bool used_raw_block = false;

#if !LZHAM_FORCE_ALL_RAW_BLOCKS
   #if (defined(LZHAM_DISABLE_RAW_BLOCKS) || defined(LZHAM_LZDEBUG))
       if (0)
   #else
       // TODO: Allow the user to control this threshold, i.e. if less than 1% then just store uncompressed.
       if (compressed_size >= buf_len)
   #endif
#endif
      {
         // Failed to compress the block, so go back to our original state and just code a raw block.
         m_state = m_start_of_block_state;
         m_step = initial_step;
         //m_stats = initial_stats;

         m_codec.reset();

         if (!m_codec.start_encoding(buf_len + 16))
         {
            LZHAM_LOG_ERROR(7060);
            return false;
         }

         if (!m_block_index)
         {
            if (!send_configuration())
            {
               LZHAM_LOG_ERROR(7061);
               return false;
            }
         }

#ifdef LZHAM_LZDEBUG
         if (!m_codec.encode_bits(166, 12))
         {
            LZHAM_LOG_ERROR(7062);
            return false;
         }
#endif

         if (!m_codec.encode_bits(cRawBlock, cBlockHeaderBits))
         {
            LZHAM_LOG_ERROR(7063);
            return false;
         }

         LZHAM_ASSERT(buf_len <= 0x1000000);
         if (!m_codec.encode_bits(buf_len - 1, 24))
         {
            LZHAM_LOG_ERROR(7064);
            return false;
         }

         // Write buf len check bits, to help increase the probability of detecting corrupted data more early.
         uint buf_len0 = (buf_len - 1) & 0xFF;
         uint buf_len1 = ((buf_len - 1) >> 8) & 0xFF;
         uint buf_len2 = ((buf_len - 1) >> 16) & 0xFF;
         if (!m_codec.encode_bits((buf_len0 ^ buf_len1) ^ buf_len2, 8))
         {
            LZHAM_LOG_ERROR(7065);
            return false;
         }

         if (!m_codec.encode_align_to_byte())
         {
            LZHAM_LOG_ERROR(7066);
            return false;
         }

         const uint8* pSrc = m_accel.get_ptr(m_block_start_dict_ofs);

         for (uint i = 0; i < buf_len; i++)
         {
            if (!m_codec.encode_bits(*pSrc++, 8))
            {
               LZHAM_LOG_ERROR(7067);
               return false;
            }
         }

         if (!m_codec.stop_encoding(true))
         {
            LZHAM_LOG_ERROR(7068);
            return false;
         }

         //used_raw_block = true;
         emit_reset_update_rate_command = false;
      }

      {
         scoped_perf_section append_timer("append");

         if (m_comp_buf.empty())
         {
            m_comp_buf.swap(m_codec.get_encoding_buf());
         }
         else
         {
            if (!m_comp_buf.append(m_codec.get_encoding_buf()))
            {
               LZHAM_LOG_ERROR(7069);
               return false;
            }
         }
      }

#if LZHAM_UPDATE_STATS
      LZHAM_VERIFY(m_stats.m_total_bytes == m_src_size);
      if (emit_reset_update_rate_command)
         m_stats.m_total_update_rate_resets++;
#endif

      m_block_index++;

      return true;
   }